

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O0

vector bucket_get_pairs_value(bucket b,comparable_callback compare_cb,void *key)

{
  int iVar1;
  undefined8 *element;
  undefined8 in_RDX;
  code *in_RSI;
  ulong *in_RDI;
  pair p;
  vector v;
  size_t iterator;
  ulong local_28;
  vector local_8;
  
  if (in_RDI[2] == 0) {
    local_8 = (vector)0x0;
  }
  else {
    local_8 = vector_create(0x11ca37);
    for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
      element = (undefined8 *)(in_RDI[2] + local_28 * 0x10);
      iVar1 = (*in_RSI)(in_RDX,*element);
      if (iVar1 == 0) {
        vector_push_back(local_8,element);
      }
    }
  }
  return local_8;
}

Assistant:

vector bucket_get_pairs_value(bucket b, comparable_callback compare_cb, void *key)
{
	size_t iterator;
	vector v;

	if (b->pairs == NULL)
	{
		return NULL;
	}

	v = vector_create(sizeof(void *));

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			vector_push_back(v, &p->value);
		}
	}

	return v;
}